

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

HighsInt __thiscall
HighsCliqueTable::runCliqueSubsumption
          (HighsCliqueTable *this,HighsDomain *globaldom,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique)

{
  anon_class_8_1_8991fb9c_for__M_pred __pred;
  anon_class_8_1_2cb8415f_for__M_pred __pred_00;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __last;
  const_iterator __last_00;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __last_01;
  const_iterator __last_02;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __first;
  const_iterator __first_00;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __first_01;
  const_iterator __first_02;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference piVar4;
  reference pvVar5;
  reference pvVar6;
  reference pCVar7;
  int __c;
  int __c_00;
  int __c_01;
  HighsCliqueTable *in_RDX;
  CliqueVar **__s;
  char *pcVar8;
  long in_RDI;
  bool vHasClq;
  bool sizeTwo;
  CliqueVar v_1;
  iterator __end5;
  iterator __begin5;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range5;
  HighsInt len;
  HighsInt hits;
  HighsInt cliqueid;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  CliqueVar v;
  iterator __end1;
  iterator __begin1;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range1;
  bool redundant;
  HighsInt nremoved;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffe78;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  HighsInt in_stack_fffffffffffffea0;
  HighsInt in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  value_type in_stack_fffffffffffffeac;
  vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
  *in_stack_fffffffffffffeb8;
  HighsCliqueTable *this_00;
  CliqueVar local_dc;
  CliqueVar *local_d8;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_d0;
  HighsCliqueTable *local_c8;
  value_type local_bc;
  value_type local_b8;
  int local_b4;
  int *local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  long local_a0;
  char local_90 [12];
  CliqueVar local_84;
  CliqueVar *local_80;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_78;
  HighsCliqueTable *local_70;
  CliqueVar *local_68;
  CliqueVar *local_60;
  CliqueVar *local_48;
  CliqueVar *local_40;
  CliqueVar *local_38;
  byte local_25;
  int local_24;
  HighsCliqueTable *local_20;
  int local_4;
  
  local_20 = in_RDX;
  sVar2 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size(&in_RDX->cliqueentries);
  if (sVar2 == 2) {
    local_4 = 0;
  }
  else {
    local_24 = 0;
    local_25 = 0;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 400));
    sVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
                      ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                        *)(in_RDI + 0xb8));
    if (sVar2 < sVar3) {
      std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
                ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                 (in_RDI + 0xb8));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    }
    this_00 = local_20;
    local_40 = (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               begin(in_stack_fffffffffffffe78);
    local_48 = (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               end(in_stack_fffffffffffffe78);
    __first._M_current._4_4_ = in_stack_fffffffffffffeac;
    __first._M_current._0_4_ = in_stack_fffffffffffffea8;
    __last._M_current._4_4_ = in_stack_fffffffffffffea4;
    __last._M_current._0_4_ = in_stack_fffffffffffffea0;
    __pred.this._7_1_ = in_stack_fffffffffffffe9f;
    __pred.this._0_7_ = in_stack_fffffffffffffe98;
    local_38 = (CliqueVar *)
               std::
               remove_if<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::runCliqueSubsumption(HighsDomain_const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&)::__0>
                         (__first,__last,__pred);
    __gnu_cxx::
    __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
    ::__normal_iterator<HighsCliqueTable::CliqueVar*>
              ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                *)in_stack_fffffffffffffe80,
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                *)in_stack_fffffffffffffe78);
    local_60 = (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               end(in_stack_fffffffffffffe78);
    __gnu_cxx::
    __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
    ::__normal_iterator<HighsCliqueTable::CliqueVar*>
              ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                *)in_stack_fffffffffffffe80,
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                *)in_stack_fffffffffffffe78);
    __first_00._M_current._4_4_ = in_stack_fffffffffffffeac;
    __first_00._M_current._0_4_ = in_stack_fffffffffffffea8;
    __last_00._M_current._4_4_ = in_stack_fffffffffffffea4;
    __last_00._M_current._0_4_ = in_stack_fffffffffffffea0;
    local_68 = (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),__first_00,
                     __last_00);
    local_70 = local_20;
    local_78._M_current =
         (CliqueVar *)
         std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
         begin(in_stack_fffffffffffffe78);
    local_80 = (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               end(in_stack_fffffffffffffe78);
    while( true ) {
      __s = &local_80;
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe80,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      pCVar7 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(&local_78);
      local_84 = *pCVar7;
      pcVar8 = CliqueVar::index(&local_84,(char *)__s,__c);
      std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
                ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
                 (in_RDI + 0x18),(long)(int)pcVar8);
      pcVar8 = local_90;
      HighsHashTree<int,int>::
      for_each<HighsCliqueTable::runCliqueSubsumption(HighsDomain_const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&)::__1>
                ((HighsHashTree<int,_int> *)in_stack_fffffffffffffe80,
                 (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffeb8 =
           (vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *)
           (in_RDI + 0x30);
      pcVar8 = CliqueVar::index(&local_84,pcVar8,__c_00);
      std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::operator[]
                (in_stack_fffffffffffffeb8,(long)(int)pcVar8);
      HighsHashTree<int,void>::
      for_each<HighsCliqueTable::runCliqueSubsumption(HighsDomain_const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&)::__2>
                ((HighsHashTree<int,_void> *)in_stack_fffffffffffffe80,
                 (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
      __gnu_cxx::
      __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
      ::operator++(&local_78);
    }
    local_a0 = in_RDI + 0x1a8;
    local_a8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
    local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffe80,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffe78), bVar1) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_a8);
      local_b4 = *piVar4;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 400),
                          (long)local_b4);
      local_b8 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 400),
                          (long)local_b4);
      *pvVar5 = 0;
      pvVar6 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)(in_RDI + 0xb8),(long)local_b4);
      in_stack_fffffffffffffea4 = pvVar6->end;
      pvVar6 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)(in_RDI + 0xb8),(long)local_b4);
      in_stack_fffffffffffffea8 = in_stack_fffffffffffffea4 - pvVar6->start;
      pvVar6 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)(in_RDI + 0xb8),(long)local_b4);
      local_bc = in_stack_fffffffffffffea8 - pvVar6->numZeroFixed;
      in_stack_fffffffffffffeac = local_b8;
      sVar2 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::size(&local_20->cliqueentries);
      if (in_stack_fffffffffffffeac == (value_type)sVar2) {
        local_25 = 1;
      }
      else if (local_bc == local_b8) {
        pvVar6 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                             *)(in_RDI + 0xb8),(long)local_b4);
        if ((pvVar6->equality & 1U) == 0) {
          local_24 = local_24 + 1;
          pvVar6 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)(in_RDI + 0xb8),(long)local_b4);
          pvVar6->origin = 0x7fffffff;
          removeClique(this_00,(HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        }
        else {
          local_c8 = local_20;
          local_d0._M_current =
               (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               begin(in_stack_fffffffffffffe78);
          local_d8 = (CliqueVar *)
                     std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::end(in_stack_fffffffffffffe78);
          while (bVar1 = __gnu_cxx::operator!=
                                   (in_stack_fffffffffffffe80,
                                    (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                     *)in_stack_fffffffffffffe78), bVar1) {
            pCVar7 = __gnu_cxx::
                     __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                     ::operator*(&local_d0);
            local_dc = *pCVar7;
            pvVar6 = std::
                     vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                     operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)(in_RDI + 0xb8),(long)local_b4);
            in_stack_fffffffffffffea0 = pvVar6->end;
            pcVar8 = (char *)(long)local_b4;
            pvVar6 = std::
                     vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                     operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)(in_RDI + 0xb8),(size_type)pcVar8);
            if (in_stack_fffffffffffffea0 - pvVar6->start == 2) {
              in_stack_fffffffffffffe90 =
                   (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)(in_RDI + 0x30);
              pcVar8 = CliqueVar::index(&local_dc,pcVar8,__c_01);
              std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::
              operator[]((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                          *)in_stack_fffffffffffffe90,(long)(int)pcVar8);
              in_stack_fffffffffffffe9f =
                   HighsHashTree<int,_void>::contains
                             ((HighsHashTree<int,_void> *)in_stack_fffffffffffffe90,
                              (int *)in_stack_fffffffffffffe88);
            }
            else {
              in_stack_fffffffffffffe88 = (value_type *)(in_RDI + 0x18);
              pcVar8 = CliqueVar::index(&local_dc,pcVar8,__c_01);
              std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
              operator[]((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                          *)in_stack_fffffffffffffe88,(long)(int)pcVar8);
              in_stack_fffffffffffffe9f =
                   HighsHashTree<int,_int>::contains
                             ((HighsHashTree<int,_int> *)in_stack_fffffffffffffe90,
                              (int *)in_stack_fffffffffffffe88);
            }
            if ((bool)in_stack_fffffffffffffe9f == false) {
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            }
            __gnu_cxx::
            __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
            ::operator++(&local_d0);
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_a8);
    }
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x530a39);
    if ((local_25 & 1) != 0) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::clear
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x530a50);
    }
    bVar1 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            empty(in_stack_fffffffffffffe90);
    if (!bVar1) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::begin
                (in_stack_fffffffffffffe78);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                (in_stack_fffffffffffffe78);
      __first_01._M_current._4_4_ = in_stack_fffffffffffffeac;
      __first_01._M_current._0_4_ = in_stack_fffffffffffffea8;
      __last_01._M_current._4_4_ = in_stack_fffffffffffffea4;
      __last_01._M_current._0_4_ = in_stack_fffffffffffffea0;
      __pred_00.globaldom._7_1_ = in_stack_fffffffffffffe9f;
      __pred_00.globaldom._0_7_ = in_stack_fffffffffffffe98;
      std::
      remove_if<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::runCliqueSubsumption(HighsDomain_const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&)::__3>
                (__first_01,__last_01,__pred_00);
      __gnu_cxx::
      __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
      ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  *)local_20,
                 (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  *)in_stack_fffffffffffffe78);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                (in_stack_fffffffffffffe78);
      __gnu_cxx::
      __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
      ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  *)local_20,
                 (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  *)in_stack_fffffffffffffe78);
      __first_02._M_current._4_4_ = in_stack_fffffffffffffeac;
      __first_02._M_current._0_4_ = in_stack_fffffffffffffea8;
      __last_02._M_current._4_4_ = in_stack_fffffffffffffea4;
      __last_02._M_current._0_4_ = in_stack_fffffffffffffea0;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::erase
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),__first_02,
                 __last_02);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

HighsInt HighsCliqueTable::runCliqueSubsumption(
    const HighsDomain& globaldom, std::vector<CliqueVar>& clique) {
  if (clique.size() == 2) return 0;
  HighsInt nremoved = 0;
  bool redundant = false;
  if (cliquehits.size() < cliques.size()) cliquehits.resize(cliques.size());

  clique.erase(
      std::remove_if(clique.begin(), clique.end(),
                     [&](CliqueVar clqvar) { return colDeleted[clqvar.col]; }),
      clique.end());

  for (CliqueVar v : clique) {
    invertedHashList[v.index()].for_each([&](HighsInt cliqueid) {
      if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

      ++cliquehits[cliqueid];
    });

    // for (const auto& entry : invertedHashListSizeTwo[v.index()])
    invertedHashListSizeTwo[v.index()].for_each([&](HighsInt cliqueid) {
      if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

      ++cliquehits[cliqueid];
    });
  }

  for (HighsInt cliqueid : cliquehitinds) {
    HighsInt hits = cliquehits[cliqueid];
    cliquehits[cliqueid] = 0;

    HighsInt len = cliques[cliqueid].end - cliques[cliqueid].start -
                   cliques[cliqueid].numZeroFixed;
    if (hits == (HighsInt)clique.size())
      redundant = true;
    else if (len == hits) {
      if (cliques[cliqueid].equality) {
        for (CliqueVar v : clique) {
          bool sizeTwo = cliques[cliqueid].end - cliques[cliqueid].start == 2;
          bool vHasClq =
              sizeTwo ? invertedHashListSizeTwo[v.index()].contains(cliqueid)
                      : invertedHashList[v.index()].contains(cliqueid);
          if (!vHasClq) infeasvertexstack.push_back(v);
        }
      } else {
        ++nremoved;
        cliques[cliqueid].origin = kHighsIInf;
        removeClique(cliqueid);
      }
    }
  }

  cliquehitinds.clear();

  if (redundant) clique.clear();

  if (!infeasvertexstack.empty()) {
    clique.erase(
        std::remove_if(clique.begin(), clique.end(),
                       [&](CliqueVar v) { return globaldom.isFixed(v.col); }),
        clique.end());
  }

  return nremoved;
}